

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt_utils.h
# Opt level: O2

int is_winner_mode_processing_enabled
              (AV1_COMP *cpi,MACROBLOCK *x,MB_MODE_INFO *mbmi,int actual_txfm_skip)

{
  byte bVar1;
  uint8_t uVar2;
  int iVar3;
  
  bVar1 = mbmi->mode;
  uVar2 = mbmi->skip_txfm;
  iVar3 = (cpi->sf).winner_mode_sf.prune_winner_mode_eval_level;
  if (iVar3 == 3) {
    if ((((0x18 < bVar1) || ((0x1390000U >> (bVar1 & 0x1f) & 1) == 0)) && (bVar1 != 0x16)) &&
       ((uVar2 != '\0' && (x->qindex < 0x80)))) {
      return 0;
    }
  }
  else if (iVar3 != 2) {
    if (iVar3 == 1) {
      if (x->source_variance < (x->qindex * 0x30) / -0x100 + 0x40U) {
        return 0;
      }
    }
    else if (3 < iVar3) {
      if ((cpi->sf).rd_sf.perform_coeff_opt < 5) {
        if (uVar2 != '\0') {
          return 0;
        }
      }
      else if (uVar2 != '\0' && 0x46 < x->qindex) {
        return 0;
      }
    }
  }
  if (((char)*(ushort *)&mbmi->field_0xa7 < '\0') || ('\0' < mbmi->ref_frame[0])) {
    if ((0xf3 < (byte)(bVar1 - 0x19)) &&
       (((cpi->sf).tx_sf.tx_type_search.fast_inter_tx_type_prob_thresh != 0x7fffffff &&
        ((cpi->oxcf).txfm_cfg.use_inter_dct_only == false)))) {
      return 1;
    }
  }
  else if ((((cpi->sf).tx_sf.tx_type_search.fast_intra_tx_type_search != 0) &&
           ((cpi->oxcf).txfm_cfg.use_intra_default_tx_only == false)) &&
          ((cpi->oxcf).txfm_cfg.use_intra_dct_only != true)) {
    return 1;
  }
  if (((cpi->sf).winner_mode_sf.enable_winner_mode_for_coeff_opt != 0) &&
     ((cpi->optimize_seg_arr[*(ushort *)&mbmi->field_0xa7 & 7] & 0xfd) != 0)) {
    return 1;
  }
  return (int)((cpi->sf).winner_mode_sf.enable_winner_mode_for_tx_size_srch != 0);
}

Assistant:

static inline int is_winner_mode_processing_enabled(const struct AV1_COMP *cpi,
                                                    const MACROBLOCK *const x,
                                                    MB_MODE_INFO *const mbmi,
                                                    int actual_txfm_skip) {
  const SPEED_FEATURES *sf = &cpi->sf;
  const PREDICTION_MODE best_mode = mbmi->mode;

  if (bypass_winner_mode_processing(x, sf, mbmi->skip_txfm, actual_txfm_skip,
                                    best_mode))
    return 0;

  // TODO(any): Move block independent condition checks to frame level
  if (is_inter_block(mbmi)) {
    if (is_inter_mode(best_mode) &&
        (sf->tx_sf.tx_type_search.fast_inter_tx_type_prob_thresh != INT_MAX) &&
        !cpi->oxcf.txfm_cfg.use_inter_dct_only)
      return 1;
  } else {
    if (sf->tx_sf.tx_type_search.fast_intra_tx_type_search &&
        !cpi->oxcf.txfm_cfg.use_intra_default_tx_only &&
        !cpi->oxcf.txfm_cfg.use_intra_dct_only)
      return 1;
  }

  // Check speed feature related to winner mode processing
  if (sf->winner_mode_sf.enable_winner_mode_for_coeff_opt &&
      cpi->optimize_seg_arr[mbmi->segment_id] != NO_TRELLIS_OPT &&
      cpi->optimize_seg_arr[mbmi->segment_id] != FINAL_PASS_TRELLIS_OPT)
    return 1;
  if (sf->winner_mode_sf.enable_winner_mode_for_tx_size_srch) return 1;

  return 0;
}